

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O2

ColumnBinding __thiscall
duckdb::TableBinding::GetColumnBinding(TableBinding *this,column_t column_index)

{
  vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>> *this_00;
  reference pvVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong __n;
  ColumnBinding CVar6;
  column_t local_30;
  
  this_00 = (vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>> *)
            this->bound_column_ids;
  lVar4 = *(long *)this_00;
  lVar2 = *(long *)(this_00 + 8);
  uVar5 = lVar2 - lVar4 >> 5;
  __n = 0;
  local_30 = column_index;
  do {
    uVar3 = lVar2 - lVar4 >> 5;
    if (uVar3 <= __n) {
LAB_0130897d:
      if (uVar5 == uVar3) {
        ::std::vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>>::
        emplace_back<unsigned_long&>(this_00,&local_30);
      }
      CVar6.column_index = uVar5;
      CVar6.table_index = (this->super_Binding).index;
      return CVar6;
    }
    pvVar1 = vector<duckdb::ColumnIndex,_true>::get<true>
                       ((vector<duckdb::ColumnIndex,_true> *)this_00,__n);
    lVar4 = *(long *)this_00;
    lVar2 = *(long *)(this_00 + 8);
    if (pvVar1->index == column_index) {
      uVar3 = lVar2 - lVar4 >> 5;
      uVar5 = __n;
      goto LAB_0130897d;
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

ColumnBinding TableBinding::GetColumnBinding(column_t column_index) {
	auto &column_ids = bound_column_ids;
	ColumnBinding binding;

	// Locate the column_id that matches the 'column_index'
	binding.column_index = column_ids.size();
	for (idx_t i = 0; i < column_ids.size(); ++i) {
		auto &col_id = column_ids[i];
		if (col_id.GetPrimaryIndex() == column_index) {
			binding.column_index = i;
			break;
		}
	}
	// If it wasn't found, add it
	if (binding.column_index == column_ids.size()) {
		column_ids.emplace_back(column_index);
	}

	binding.table_index = index;
	return binding;
}